

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::Directory>::ReplacerImpl
          (ReplacerImpl<kj::Directory> *this,InMemoryDirectory *directory,StringPtr name,
          Own<const_kj::Directory> *inner,WriteMode mode)

{
  Own<const_kj::Directory> *other;
  char *pcVar1;
  StringPtr value;
  WriteMode mode_local;
  Own<const_kj::Directory> *inner_local;
  InMemoryDirectory *directory_local;
  ReplacerImpl<kj::Directory> *this_local;
  StringPtr name_local;
  
  pcVar1 = (char *)name.content.size_;
  Directory::Replacer<kj::Directory>::Replacer(&this->super_Replacer<kj::Directory>,mode);
  (this->super_Replacer<kj::Directory>)._vptr_Replacer = (_func_int **)&PTR_get_004adbb8;
  (this->super_Replacer<kj::Directory>).field_0xc = 0;
  atomicAddRef<kj::(anonymous_namespace)::InMemoryDirectory>((kj *)&this->directory,directory);
  value.content.size_ = (size_t)pcVar1;
  value.content.ptr = (char *)name.content.size_;
  heapString(&this->name,(kj *)name.content.ptr,value);
  other = mv<kj::Own<kj::Directory_const>>(inner);
  Own<const_kj::Directory>::Own(&this->inner,other);
  return;
}

Assistant:

ReplacerImpl(const InMemoryDirectory& directory, kj::StringPtr name,
                 Own<const T> inner, WriteMode mode)
        : Replacer<T>(mode), directory(atomicAddRef(directory)), name(heapString(name)),
          inner(kj::mv(inner)) {}